

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeMessage
          (ParserImpl *this,Message *message,string *delimiter)

{
  size_t sVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  undefined1 *local_70;
  size_t local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  do {
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,">","");
    sVar1 = (this->tokenizer_).current_.text._M_string_length;
    if (sVar1 == local_48) {
      if (sVar1 == 0) {
        bVar3 = true;
      }
      else {
        iVar2 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_50,sVar1);
        bVar3 = iVar2 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    if (bVar3) {
LAB_003bf91c:
      bVar4 = false;
    }
    else {
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"}","");
      sVar1 = (this->tokenizer_).current_.text._M_string_length;
      bVar4 = true;
      if (sVar1 == local_68) {
        if (sVar1 == 0) goto LAB_003bf91c;
        iVar2 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_70,sVar1);
        bVar4 = iVar2 != 0;
      }
    }
    if ((!bVar3) && (local_70 != local_60)) {
      operator_delete(local_70);
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    if (!bVar4) {
      bVar3 = Consume(this,delimiter);
      return bVar3;
    }
    bVar3 = ConsumeField(this,message);
    if (!bVar3) {
      return false;
    }
  } while( true );
}

Assistant:

bool ConsumeMessage(Message* message, const std::string delimiter) {
    while (!LookingAt(">") && !LookingAt("}")) {
      DO(ConsumeField(message));
    }

    // Confirm that we have a valid ending delimiter.
    DO(Consume(delimiter));
    return true;
  }